

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void lua_rawseti(lua_State *L,int idx,int n)

{
  StkId pTVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  int in_ESI;
  lua_State *in_RDI;
  TValue *o1;
  TValue *o2;
  StkId o;
  
  pTVar2 = index2adr(in_RDI,in_ESI);
  pTVar1 = in_RDI->top;
  pTVar3 = luaH_setnum((lua_State *)o2,(Table *)o1,(int)((ulong)in_RDI >> 0x20));
  pTVar3->value = pTVar1[-1].value;
  pTVar3->tt = pTVar1[-1].tt;
  if (((3 < in_RDI->top[-1].tt) && ((((in_RDI->top[-1].value.gc)->gch).marked & 3) != 0)) &&
     (((((pTVar2->value).gc)->gch).marked & 4) != 0)) {
    luaC_barrierback(in_RDI,&((pTVar2->value).gc)->h);
  }
  in_RDI->top = in_RDI->top + -1;
  return;
}

Assistant:

static void lua_rawseti(lua_State*L,int idx,int n){
StkId o;
api_checknelems(L,1);
o=index2adr(L,idx);
luai_apicheck(L,ttistable(o));
setobj(L,luaH_setnum(L,hvalue(o),n),L->top-1);
luaC_barriert(L,hvalue(o),L->top-1);
L->top--;
}